

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

el_action_t ed_insert(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  bool bVar3;
  wchar_t local_20;
  wchar_t count;
  wint_t c_local;
  EditLine *el_local;
  
  local_20 = (el->el_state).argument;
  if (c == 0) {
    el_local._7_1_ = '\x06';
  }
  else if (((el->el_line).lastchar + (el->el_state).argument < (el->el_line).limit) ||
          (wVar2 = ch_enlargebufs(el,(long)local_20), wVar2 != L'\0')) {
    if (local_20 == L'\x01') {
      if (((el->el_state).inputmode == L'\0') || ((el->el_line).lastchar <= (el->el_line).cursor)) {
        c_insert(el,L'\x01');
      }
      pwVar1 = (el->el_line).cursor;
      (el->el_line).cursor = pwVar1 + 1;
      *pwVar1 = c;
      re_fastaddc(el);
    }
    else {
      if ((el->el_state).inputmode != L'\x02') {
        c_insert(el,(el->el_state).argument);
      }
      while( true ) {
        bVar3 = false;
        if (local_20 != L'\0') {
          bVar3 = (el->el_line).cursor < (el->el_line).lastchar;
        }
        if (!bVar3) break;
        pwVar1 = (el->el_line).cursor;
        (el->el_line).cursor = pwVar1 + 1;
        *pwVar1 = c;
        local_20 = local_20 + L'\xffffffff';
      }
      re_refresh(el);
    }
    if ((el->el_state).inputmode == L'\x02') {
      el_local._7_1_ = vi_command_mode(el,0);
    }
    else {
      el_local._7_1_ = '\0';
    }
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
ed_insert(EditLine *el, wint_t c)
{
	int count = el->el_state.argument;

	if (c == '\0')
		return CC_ERROR;

	if (el->el_line.lastchar + el->el_state.argument >=
	    el->el_line.limit) {
		/* end of buffer space, try to allocate more */
		if (!ch_enlargebufs(el, (size_t) count))
			return CC_ERROR;	/* error allocating more */
	}

	if (count == 1) {
		if (el->el_state.inputmode == MODE_INSERT
		    || el->el_line.cursor >= el->el_line.lastchar)
			c_insert(el, 1);

		*el->el_line.cursor++ = c;
		re_fastaddc(el);		/* fast refresh for one char. */
	} else {
		if (el->el_state.inputmode != MODE_REPLACE_1)
			c_insert(el, el->el_state.argument);

		while (count-- && el->el_line.cursor < el->el_line.lastchar)
			*el->el_line.cursor++ = c;
		re_refresh(el);
	}

	if (el->el_state.inputmode == MODE_REPLACE_1)
		return vi_command_mode(el, 0);

	return CC_NORM;
}